

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

void __thiscall LowererMD::EmitShiftByScalarI2(LowererMD *this,Instr *instr,JnHelperMethod helper)

{
  Opnd *dst;
  MemRefOpnd *pMVar1;
  Instr *instr_00;
  
  dst = instr->m_dst;
  LoadHelperArgument(this,instr,instr->m_src2);
  pMVar1 = LoadSimdHelperArgument(this,instr,'\0');
  Lowerer::InsertMove(&pMVar1->super_Opnd,instr->m_src1,instr,true);
  pMVar1 = LoadSimdHelperArgument(this,instr,'\x01');
  instr_00 = IR::Instr::New(CALL,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  ChangeToHelperCall(this,instr_00,helper,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false
                    );
  Lowerer::InsertMove(dst,&pMVar1->super_Opnd,instr,true);
  return;
}

Assistant:

void LowererMD::EmitShiftByScalarI2(IR::Instr *instr, IR::JnHelperMethod helper)
{
    IR::Opnd* src2 = instr->GetSrc2();
    IR::Opnd* dst = instr->GetDst();
    LoadHelperArgument(instr, src2);
    IR::MemRefOpnd* srcMemRef = LoadSimdHelperArgument(instr, 0);
    m_lowerer->InsertMove(srcMemRef, instr->GetSrc1(), instr);
    IR::MemRefOpnd* dstMemRef = LoadSimdHelperArgument(instr, 1);
    IR::Instr * helperCall = IR::Instr::New(Js::OpCode::CALL, this->m_func);
    instr->InsertBefore(helperCall);
    this->ChangeToHelperCall(helperCall, helper);
    m_lowerer->InsertMove(dst, dstMemRef, instr);
}